

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACS.cpp
# Opt level: O2

void __thiscall imrt::ACS::generateTours(ACS *this)

{
  int a;
  long lVar1;
  double dVar2;
  double local_28;
  
  local_28 = 1.79769313486232e+308;
  for (lVar1 = 0; lVar1 < (this->super_ACO).n_ants; lVar1 = lVar1 + 1) {
    Ant::generateTour((this->super_ACO).ants.
                      super__Vector_base<imrt::Ant_*,_std::allocator<imrt::Ant_*>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar1],&(this->super_ACO).probability,
                      &(this->super_ACO).iprobability);
    dVar2 = Ant::getEvaluation((this->super_ACO).ants.
                               super__Vector_base<imrt::Ant_*,_std::allocator<imrt::Ant_*>_>._M_impl
                               .super__Vector_impl_data._M_start[lVar1]);
    if (dVar2 < local_28) {
      local_28 = Ant::getEvaluation((this->super_ACO).ants.
                                    super__Vector_base<imrt::Ant_*,_std::allocator<imrt::Ant_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start[lVar1]);
      (this->super_ACO).iteration_best =
           (this->super_ACO).ants.super__Vector_base<imrt::Ant_*,_std::allocator<imrt::Ant_*>_>.
           _M_impl.super__Vector_impl_data._M_start[lVar1];
    }
  }
  return;
}

Assistant:

void ACS::generateTours() {
    double best_eval=DBL_MAX;
    for (int a=0; a < n_ants; a++) {
      ants[a]->generateTour(probability, iprobability);
      if (ants[a]->getEvaluation() < best_eval) {
        best_eval = ants[a]->getEvaluation();
        iteration_best = ants[a];
      }
    }
  }